

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

float __thiscall gui::Slider::getThumbWidth(Slider *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = this->step_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar3 = (this->size_).x;
    fVar1 = floorf(((this->range_).second - (this->range_).first) / fVar1);
    fVar1 = fVar1 + 1.0;
  }
  else {
    fVar1 = (this->size_).x;
    fVar3 = fVar1;
  }
  fVar2 = ((this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          thumbMinWidth_;
  if (fVar2 <= fVar3 / fVar1) {
    fVar2 = fVar3 / fVar1;
  }
  return fVar2;
}

Assistant:

float Slider::getThumbWidth() const {
    float numThumbPositions;
    if (step_ == 0.0f) {
        numThumbPositions = size_.x;
    } else {
        numThumbPositions = std::floor((range_.second - range_.first) / step_) + 1.0f;
    }
    return std::max(size_.x / numThumbPositions, style_->thumbMinWidth_);
}